

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteLittleEndian32(CodedOutputStream *this,uint32 value)

{
  bool bVar1;
  uint8 *local_38;
  uint8 *ptr;
  uint8 local_18 [4];
  uint32 uStack_14;
  bool use_fast;
  uint8 bytes [4];
  uint32 value_local;
  CodedOutputStream *this_local;
  
  bVar1 = (uint)this->buffer_size_ < 4;
  if (bVar1) {
    local_38 = local_18;
  }
  else {
    local_38 = this->buffer_;
  }
  uStack_14 = value;
  _bytes = this;
  WriteLittleEndian32ToArray(value,local_38);
  if (bVar1) {
    WriteRaw(this,local_18,4);
  }
  else {
    Advance(this,4);
  }
  return;
}

Assistant:

void CodedOutputStream::WriteLittleEndian32(uint32 value) {
  uint8 bytes[sizeof(value)];

  bool use_fast = buffer_size_ >= sizeof(value);
  uint8* ptr = use_fast ? buffer_ : bytes;

  WriteLittleEndian32ToArray(value, ptr);

  if (use_fast) {
    Advance(sizeof(value));
  } else {
    WriteRaw(bytes, sizeof(value));
  }
}